

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VLinearCombination(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  realtype ONE;
  int i;
  N_Vector z_local;
  N_Vector *X_local;
  realtype *c_local;
  int nvec_local;
  
  if (z->ops->nvlinearcombination == (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0) {
    (*z->ops->nvscale)(*c,*X,z);
    for (ONE._4_4_ = 1; ONE._4_4_ < nvec; ONE._4_4_ = ONE._4_4_ + 1) {
      (*z->ops->nvlinearsum)(c[ONE._4_4_],X[ONE._4_4_],1.0,z,z);
    }
    c_local._4_4_ = 0;
  }
  else {
    c_local._4_4_ = (*z->ops->nvlinearcombination)(nvec,c,X,z);
  }
  return c_local._4_4_;
}

Assistant:

int N_VLinearCombination(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int i;
  realtype ONE=RCONST(1.0);

  if (z->ops->nvlinearcombination != NULL) {

    return(z->ops->nvlinearcombination(nvec, c, X, z));

  } else {

    z->ops->nvscale(c[0], X[0], z);
    for (i=1; i<nvec; i++) {
      z->ops->nvlinearsum(c[i], X[i], ONE, z, z);
    }
    return(0);

  }
}